

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::matcher<(anonymous_namespace)::yaml_output>::set_error
          (matcher<(anonymous_namespace)::yaml_output> *this,
          parser<(anonymous_namespace)::yaml_output> *parser,error_code *err)

{
  error_category *in_RCX;
  int iVar1;
  
  iVar1 = (int)err;
  if (iVar1 != 0 || (parser->error_)._M_value == 0) {
    (parser->error_)._M_value = iVar1;
    (parser->error_)._M_cat = in_RCX;
    if (iVar1 != 0) {
      this->state_ = 1;
    }
    return iVar1 != 0;
  }
  assert_failed("!error_ || err",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0xe3);
}

Assistant:

bool set_error (parser<Callbacks> & parser, std::error_code const & err) noexcept {
                    bool const has_error = parser.set_error (err);
                    if (has_error) {
                        set_state (done);
                    }
                    return has_error;
                }